

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

bool __thiscall
viennamath::rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_>::
customize(rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this,
         rt_expression_interface<double> *ptr,string *str)

{
  mapped_type *this_00;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *local_78;
  long local_68;
  id_type local_50;
  id_type local_48;
  undefined1 local_40 [8];
  KeyType key;
  FuncSymbol *temp;
  string *str_local;
  rt_expression_interface<double> *ptr_local;
  rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (ptr == (rt_expression_interface<double> *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = __dynamic_cast(ptr,&rt_expression_interface<double>::typeinfo,
                              &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                               typeinfo,0);
  }
  if (local_68 == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (ptr == (rt_expression_interface<double> *)0x0) {
      local_78 = (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)0x0;
    }
    else {
      local_78 = (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)
                 __dynamic_cast(ptr,&rt_expression_interface<double>::typeinfo,
                                &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                                 typeinfo,0);
    }
    key.second = (unsigned_long)local_78;
    local_48 = rt_function_symbol<viennamath::rt_expression_interface<double>_>::id(local_78);
    local_50 = rt_function_symbol<viennamath::rt_expression_interface<double>_>::tag_id
                         ((rt_function_symbol<viennamath::rt_expression_interface<double>_> *)
                          key.second);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)local_40,&local_48,&local_50);
    this_00 = std::
              map<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->function_symbol_strings_,(key_type *)local_40);
    std::__cxx11::string::operator=((string *)this_00,(string *)str);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool customize(InterfaceType const * ptr, std::string const & str)
      {
        if (dynamic_cast< const FuncSymbol * >(ptr) != NULL)
        {
          const FuncSymbol * temp = dynamic_cast< const FuncSymbol * >(ptr);
          KeyType key(temp->id(), temp->tag_id());
          function_symbol_strings_[key] = str;
          return true;
        }
        return false;
      }